

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubtractionExpression.cpp
# Opt level: O1

BaseExpressionPtr __thiscall
Kandinsky::SubtractionExpression::derivative
          (SubtractionExpression *this,VariableExpressionPtr *variable)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  shared_ptr<Kandinsky::BaseExpression> sVar2;
  BaseExpressionPtr BVar3;
  shared_ptr<Kandinsky::BaseExpression> local_50;
  shared_ptr<Kandinsky::BaseExpression> local_40;
  Expression local_30;
  
  (*((variable->super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>).
     _M_refcount._M_pi)->_vptr__Sp_counted_base[1])(&local_40);
  (*(variable[1].super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>.
     _M_refcount._M_pi)->_vptr__Sp_counted_base[1])(&local_50);
  operator-<std::shared_ptr<Kandinsky::BaseExpression>,_std::shared_ptr<Kandinsky::BaseExpression>,_nullptr>
            (&local_30,&local_40,&local_50);
  sVar2 = BaseExpression::makePtr<Kandinsky::Expression>(&local_30);
  _Var1 = sVar2.super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi;
  local_30._vptr_Expression = (_func_int **)&PTR_variables_001166f8;
  if (local_30.m_baseExpressionPtr.
      super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_30.m_baseExpressionPtr.
               super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
    _Var1._M_pi = extraout_RDX;
  }
  if (local_50.super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_50.super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    _Var1._M_pi = extraout_RDX_00;
  }
  if (local_40.super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_40.super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    _Var1._M_pi = extraout_RDX_01;
  }
  BVar3.super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = _Var1._M_pi;
  BVar3.super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (BaseExpressionPtr)
         BVar3.super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

BaseExpressionPtr SubtractionExpression::derivative(const VariableExpressionPtr& variable) const
    {
        return makePtr(m_arg1->derivative(variable) - m_arg2->derivative(variable));
    }